

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

double __thiscall ON_Annotation::AngleRoundOff(ON_Annotation *this,ON_DimStyle *parent_style)

{
  ON_DimStyle *this_00;
  double dVar1;
  
  this_00 = Internal_StyleForFieldQuery(this,parent_style,AngularRound);
  dVar1 = ON_DimStyle::AngleRoundOff(this_00);
  return dVar1;
}

Assistant:

double ON_Annotation::AngleRoundOff(const ON_DimStyle* parent_style) const
{
  return Internal_StyleForFieldQuery(parent_style,ON_DimStyle::field::AngularRound).AngleRoundOff();
}